

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t lzh_read_pt_bitlen(lzh_stream *strm,wchar_t start,wchar_t end)

{
  lzh_br *br;
  wchar_t *pwVar1;
  lzh_dec *plVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar7 = (ulong)(uint)start;
  if (start < end) {
    plVar2 = strm->ds;
    br = &plVar2->br;
    uVar7 = (ulong)start;
    do {
      wVar4 = (plVar2->br).cache_avail;
      if (wVar4 < L'\x03') {
        wVar3 = lzh_br_fillup(strm,br);
        wVar4 = (plVar2->br).cache_avail;
        if (wVar4 < L'\x03' && wVar3 == L'\0') goto LAB_00410a5b;
      }
      wVar3 = wVar4 + L'\xfffffffd';
      uVar5 = (uint)(br->cache_buffer >> ((byte)wVar3 & 0x3f)) & 7;
      if (uVar5 == 7) {
        if (wVar4 < L'\r') {
          wVar3 = lzh_br_fillup(strm,br);
          wVar4 = (plVar2->br).cache_avail;
          if (wVar4 < L'\r' && wVar3 == L'\0') goto LAB_00410a5b;
        }
        uVar9 = br->cache_buffer >> ((char)wVar4 - 0xdU & 0x3f);
        uVar5 = 7;
        if (((uint)uVar9 >> 9 & 1) != 0) {
          uVar6 = 6;
          do {
            uVar5 = uVar6;
            uVar6 = uVar5 + 1;
            uVar8 = (uint)uVar9;
            uVar9 = (ulong)(uVar8 * 2);
          } while ((uVar8 >> 8 & 1) != 0);
          if (0xf < uVar6) {
            uVar7 = 0xffffffff;
            goto LAB_00410a5b;
          }
          uVar5 = uVar5 + 2;
        }
        wVar3 = (wVar4 - uVar5) + L'\x03';
      }
      (plVar2->br).cache_avail = wVar3;
      (plVar2->pt).bitlen[uVar7] = (uchar)uVar5;
      uVar7 = uVar7 + 1;
      pwVar1 = (plVar2->pt).freq + uVar5;
      *pwVar1 = *pwVar1 + L'\x01';
    } while ((wchar_t)uVar7 != end);
    uVar7 = (ulong)(uint)end;
  }
LAB_00410a5b:
  return (wchar_t)uVar7;
}

Assistant:

static int
lzh_read_pt_bitlen(struct lzh_stream *strm, int start, int end)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br * br = &(ds->br);
	int c, i;

	for (i = start; i < end;) {
		/*
		 *  bit pattern     the number we need
		 *     000           ->  0
		 *     001           ->  1
		 *     010           ->  2
		 *     ...
		 *     110           ->  6
		 *     1110          ->  7
		 *     11110         ->  8
		 *     ...
		 *     1111111111110 ->  16
		 */
		if (!lzh_br_read_ahead(strm, br, 3))
			return (i);
		if ((c = lzh_br_bits(br, 3)) == 7) {
			int d;
			if (!lzh_br_read_ahead(strm, br, 13))
				return (i);
			d = lzh_br_bits(br, 13);
			while (d & 0x200) {
				c++;
				d <<= 1;
			}
			if (c > 16)
				return (-1);/* Invalid data. */
			lzh_br_consume(br, c - 3);
		} else
			lzh_br_consume(br, 3);
		ds->pt.bitlen[i++] = c;
		ds->pt.freq[c]++;
	}
	return (i);
}